

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

void duckdb::Date::Convert(date_t d,int32_t *year,int32_t *month,int32_t *day)

{
  char cVar1;
  int iVar2;
  int in_EAX;
  long lVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  bool bVar6;
  int32_t year_offset;
  int32_t n;
  int local_28;
  int local_24;
  
  local_28 = in_EAX;
  local_24 = d.days;
  ExtractYearOffset(&local_24,year,&local_28);
  iVar2 = *(int *)(CUMULATIVE_YEAR_DAYS + (long)local_28 * 4);
  lVar3 = (long)local_24 - (long)iVar2;
  *day = (int32_t)lVar3;
  bVar6 = *(int *)(CUMULATIVE_YEAR_DAYS + (long)local_28 * 4 + 4) - iVar2 == 0x16e;
  puVar4 = MONTH_PER_DAY_OF_YEAR;
  if (bVar6) {
    puVar4 = LEAP_MONTH_PER_DAY_OF_YEAR;
  }
  puVar5 = CUMULATIVE_DAYS;
  if (bVar6) {
    puVar5 = CUMULATIVE_LEAP_DAYS;
  }
  cVar1 = puVar4[lVar3];
  *month = (int)cVar1;
  *day = (*day - *(int *)(puVar5 + (long)(int)cVar1 * 4 + -4)) + 1;
  return;
}

Assistant:

void Date::Convert(date_t d, int32_t &year, int32_t &month, int32_t &day) {
	auto n = d.days;
	int32_t year_offset;
	Date::ExtractYearOffset(n, year, year_offset);

	day = n - Date::CUMULATIVE_YEAR_DAYS[year_offset];
	D_ASSERT(day >= 0 && day <= 365);

	bool is_leap_year = (Date::CUMULATIVE_YEAR_DAYS[year_offset + 1] - Date::CUMULATIVE_YEAR_DAYS[year_offset]) == 366;
	if (is_leap_year) {
		month = Date::LEAP_MONTH_PER_DAY_OF_YEAR[day];
		day -= Date::CUMULATIVE_LEAP_DAYS[month - 1];
	} else {
		month = Date::MONTH_PER_DAY_OF_YEAR[day];
		day -= Date::CUMULATIVE_DAYS[month - 1];
	}
	day++;
	D_ASSERT(day > 0 && day <= (is_leap_year ? Date::LEAP_DAYS[month] : Date::NORMAL_DAYS[month]));
	D_ASSERT(month > 0 && month <= 12);
}